

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::IsObjectArrayFrozen
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr)

{
  byte bVar1;
  IndexPropertyDescriptorMap *this_00;
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar2;
  bool bVar3;
  BOOL BVar4;
  uint32 index;
  IndexPropertyDescriptor *pIVar5;
  int i;
  int i_00;
  
  BVar4 = DictionaryTypeHandlerBase<int>::IsFrozen
                    (&this->super_DictionaryTypeHandlerBase<int>,(DynamicObject *)arr);
  if (BVar4 != 0) {
    for (i_00 = 0; this_00 = (this->indexPropertyMap).ptr, pBVar2 = (this_00->indexPropertyMap).ptr,
        i_00 < pBVar2->count - pBVar2->freeCount; i_00 = i_00 + 1) {
      index = IndexPropertyDescriptorMap::GetKeyAt(this_00,i_00);
      pIVar5 = IndexPropertyDescriptorMap::GetReferenceAt((this->indexPropertyMap).ptr,i_00);
      bVar1 = pIVar5->Attributes;
      if ((bVar1 & 8) == 0) {
        if ((bVar1 & 2) != 0) {
          return 0;
        }
        if (((bVar1 & 4) != 0) && (BVar4 = HasDataItem(this,arr,index), BVar4 != 0)) {
          return 0;
        }
      }
    }
    if (((this->dataItemAttributes & 6) == 0) || (bVar3 = HasAnyDataItemNotInMap(this,arr), !bVar3))
    {
      return 1;
    }
  }
  return 0;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::IsObjectArrayFrozen(ES5Array* arr)
    {
        if (!__super::IsFrozen(arr))
        {
            return false;
        }

        for (int i = 0; i < indexPropertyMap->Count(); i++)
        {
            uint32 index = indexPropertyMap->GetKeyAt(i);
            IndexPropertyDescriptor* descriptor = indexPropertyMap->GetReferenceAt(i);

            if (descriptor->Attributes & PropertyDeleted)
            {
                continue; // Skip deleted
            }
            if (descriptor->Attributes & PropertyConfigurable)
            {
                return false;
            }

            if ((descriptor->Attributes & PropertyWritable) && HasDataItem(arr, index))
            {
                //Only data descriptor has Writable property
                return false;
            }
        }

        // Check data item not in map
        if (this->GetDataItemAttributes() & (PropertyWritable | PropertyConfigurable))
        {
            if (HasAnyDataItemNotInMap(arr))
            {
                return false;
            }
        }

        return true;
    }